

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  Parse *pParse;
  SrcList *pSVar1;
  sqlite3 *db;
  Vdbe *p;
  Table *pTVar2;
  uint uVar3;
  long lVar4;
  VdbeOp *pVVar5;
  u8 *puVar6;
  WhereLevel *pWVar7;
  int iVar8;
  WhereLevel *pWVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  
  pParse = pWInfo->pParse;
  pSVar1 = pWInfo->pTabList;
  db = pParse->db;
  p = pParse->pVdbe;
  sqlite3ExprCacheClear(pParse);
  pWVar9 = pWInfo->a;
  uVar13 = (ulong)(uint)pWInfo->nLevel;
  while (uVar12 = uVar13, 0 < (int)uVar12) {
    uVar13 = uVar12 - 1;
    pWVar7 = pWVar9 + uVar13;
    if (p->aLabel != (int *)0x0) {
      p->aLabel[~(long)pWVar7->addrCont] = p->nOp;
    }
    if (pWVar7->op != 0x95) {
      sqlite3VdbeAddOp2(p,(uint)pWVar7->op,pWVar7->p1,pWVar7->p2);
      if (p->aOp != (Op *)0x0) {
        p->aOp[(long)p->nOp + -1].p5 = pWVar7->p5;
      }
    }
    if ((((pWVar7->plan).wsFlags & 0x80f1000) != 0) && (iVar10 = (pWVar7->u).in.nIn, 0 < iVar10)) {
      if (p->aLabel != (int *)0x0) {
        p->aLabel[~(long)pWVar7->addrNxt] = p->nOp;
        iVar10 = (pWVar7->u).in.nIn;
      }
      puVar6 = &(pWVar7->u).in.aInLoop[(long)iVar10 + -1].eEndLoopOp;
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        iVar11 = *(int *)(puVar6 + -4);
        if (-2 < iVar11) {
          if (iVar11 + 1U < (uint)p->nOp) {
            p->aOp[iVar11 + 1U].p2 = p->nOp;
          }
        }
        sqlite3VdbeAddOp2(p,(uint)*puVar6,((InLoop *)(puVar6 + -8))->iCur,iVar11);
        if (0 < *(int *)(puVar6 + -4)) {
          uVar3 = *(int *)(puVar6 + -4) - 1;
          if (uVar3 < (uint)p->nOp) {
            p->aOp[uVar3].p2 = p->nOp;
          }
        }
        puVar6 = puVar6 + -0xc;
      }
      sqlite3DbFree(db,(pWVar7->u).in.aInLoop);
    }
    if (p->aLabel != (int *)0x0) {
      p->aLabel[~(long)pWVar7->addrBrk] = p->nOp;
    }
    if (pWVar7->iLeftJoin != 0) {
      uVar3 = sqlite3VdbeAddOp1(p,0x78,pWVar7->iLeftJoin);
      if (((pWVar7->plan).wsFlags & 0x400000) == 0) {
        sqlite3VdbeAddOp1(p,0x42,pSVar1->a[uVar12 - 1].iCursor);
      }
      if (-1 < pWVar7->iIdxCur) {
        sqlite3VdbeAddOp1(p,0x42,pWVar7->iIdxCur);
      }
      if (pWVar7->op == '\x03') {
        iVar10 = pWVar7->addrFirst;
        iVar11 = pWVar7->p1;
        iVar8 = 2;
      }
      else {
        iVar10 = pWVar7->addrFirst;
        iVar8 = 1;
        iVar11 = 0;
      }
      sqlite3VdbeAddOp2(p,iVar8,iVar11,iVar10);
      if ((-1 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
        p->aOp[uVar3].p2 = p->nOp;
      }
    }
  }
  if (p->aLabel != (int *)0x0) {
    p->aLabel[~(long)pWInfo->iBreak] = p->nOp;
  }
  iVar10 = 0;
  do {
    if (pWInfo->nLevel <= iVar10) {
      pParse->nQueryLoop = pWInfo->savedNQueryLoop;
      whereInfoFree(db,pWInfo);
      return;
    }
    pTVar2 = pSVar1->a[pWVar9->iFrom].pTab;
    if ((((pTVar2->tabFlags & 2) == 0) && (pTVar2->pSelect == (Select *)0x0)) &&
       ((pWInfo->wctrlFlags & 0x10) == 0)) {
      uVar3 = (pWVar9->plan).wsFlags;
      if ((uVar3 >> 0x16 & 1) == 0 && pWInfo->okOnePass == '\0') {
        sqlite3VdbeAddOp1(p,0x2d,pSVar1->a[pWVar9->iFrom].iCursor);
      }
      if (((byte)(uVar3 >> 0x1d) & 1) == 0 && (uVar3 & 0xf0000) != 0) {
        sqlite3VdbeAddOp1(p,0x2d,pWVar9->iIdxCur);
      }
    }
    lVar4 = 0x10;
    uVar3 = (pWVar9->plan).wsFlags;
    if ((uVar3 & 0xf0000) == 0) {
      lVar4 = 0x40;
      if ((uVar3 >> 0x1c & 1) != 0) goto LAB_00175911;
    }
    else {
LAB_00175911:
      lVar4 = *(long *)((long)&(pWVar9->plan).wsFlags + lVar4);
      if ((lVar4 != 0) && (db->mallocFailed == '\0')) {
        iVar11 = pWInfo->iTop;
        pVVar5 = sqlite3VdbeGetOp(p,iVar11);
        iVar8 = p->nOp;
        for (; iVar11 < iVar8; iVar11 = iVar11 + 1) {
          if (pVVar5->p1 == pWVar9->iTabCur) {
            if (pVVar5->opcode == 'A') {
              pVVar5->p1 = pWVar9->iIdxCur;
              pVVar5->opcode = 'c';
            }
            else if (pVVar5->opcode == '\x1d') {
              for (uVar13 = 0; *(ushort *)(lVar4 + 0x4c) != uVar13; uVar13 = uVar13 + 1) {
                if (pVVar5->p2 == *(int *)(*(long *)(lVar4 + 8) + uVar13 * 4)) {
                  pVVar5->p2 = (int)uVar13;
                  pVVar5->p1 = pWVar9->iIdxCur;
                  break;
                }
              }
            }
          }
          pVVar5 = pVVar5 + 1;
        }
      }
    }
    iVar10 = iVar10 + 1;
    pWVar9 = pWVar9 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  sqlite3ExprCacheClear(pParse);
  for(i=pWInfo->nLevel-1; i>=0; i--){
    pLevel = &pWInfo->a[i];
    sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    if( pLevel->op!=OP_Noop ){
      sqlite3VdbeAddOp2(v, pLevel->op, pLevel->p1, pLevel->p2);
      sqlite3VdbeChangeP5(v, pLevel->p5);
    }
    if( pLevel->plan.wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
      sqlite3DbFree(db, pLevel->u.in.aInLoop);
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->iLeftJoin ){
      int addr;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin);
      assert( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
           || (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 );
      if( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pTabList->a[i].iCursor);
      }
      if( pLevel->iIdxCur>=0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeAddOp2(v, OP_Goto, 0, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Close all of the cursors that were opened by sqlite3WhereBegin.
  */
  assert( pWInfo->nLevel==1 || pWInfo->nLevel==pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)==0
     && pTab->pSelect==0
     && (pWInfo->wctrlFlags & WHERE_OMIT_OPEN_CLOSE)==0
    ){
      int ws = pLevel->plan.wsFlags;
      if( !pWInfo->okOnePass && (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pTabItem->iCursor);
      }
      if( (ws & WHERE_INDEXED)!=0 && (ws & WHERE_TEMP_INDEX)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pLevel->iIdxCur);
      }
    }

    /* If this scan uses an index, make code substitutions to read data
    ** from the index in preference to the table. Sometimes, this means
    ** the table need never be read from. This is a performance boost,
    ** as the vdbe level waits until the table is read before actually
    ** seeking the table cursor to the record corresponding to the current
    ** position in the index.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLevel->plan.wsFlags & WHERE_INDEXED ){
      pIdx = pLevel->plan.u.pIdx;
    }else if( pLevel->plan.wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx && !db->mallocFailed){
      int k, j, last;
      VdbeOp *pOp;

      pOp = sqlite3VdbeGetOp(v, pWInfo->iTop);
      last = sqlite3VdbeCurrentAddr(v);
      for(k=pWInfo->iTop; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column ){
          for(j=0; j<pIdx->nColumn; j++){
            if( pOp->p2==pIdx->aiColumn[j] ){
              pOp->p2 = j;
              pOp->p1 = pLevel->iIdxCur;
              break;
            }
          }
          assert( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
               || j<pIdx->nColumn );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
        }
      }
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}